

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coreTypeOperations.cpp
# Opt level: O0

CoreType helics::core::coreTypeFromString(string_view type)

{
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __result;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __last;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  string_view type_00;
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  const_reference pvVar11;
  const_iterator pvVar12;
  const_iterator pvVar13;
  reference pvVar14;
  char *in_RDI;
  string type2;
  value_type *fnd;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffed8;
  int in_stack_fffffffffffffee0;
  int in_stack_fffffffffffffee4;
  undefined4 in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffeec;
  undefined4 in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef4;
  undefined4 in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  undefined4 in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff20;
  allocator<char> local_41 [33];
  const_iterator pvVar15;
  CoreType local_4;
  
  bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                    ((basic_string_view<char,_std::char_traits<char>_> *)&stack0xffffffffffffffe8);
  if (bVar1) {
    return DEFAULT;
  }
  pvVar11 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::back
                      ((basic_string_view<char,_std::char_traits<char>_> *)&stack0xffffffffffffffe8)
  ;
  if (*pvVar11 == '_') {
    std::basic_string_view<char,_std::char_traits<char>_>::remove_suffix
              ((basic_string_view<char,_std::char_traits<char>_> *)&stack0xffffffffffffffe8,1);
  }
  pvVar12 = frozen::
            unordered_map<std::basic_string_view<char,std::char_traits<char>>,helics::CoreType,57ul,frozen::elsa<std::basic_string_view<char,std::char_traits<char>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>
            ::find<std::basic_string_view<char,std::char_traits<char>>>
                      ((unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_helics::CoreType,_57UL,_frozen::elsa<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                        *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                       (basic_string_view<char,_std::char_traits<char>_> *)
                       CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  pvVar15 = pvVar12;
  pvVar13 = frozen::
            unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_helics::CoreType,_57UL,_frozen::elsa<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>
            ::end((unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_helics::CoreType,_57UL,_frozen::elsa<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   *)0x595fd8);
  if (pvVar12 == pvVar13) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
               (allocator<char> *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
    std::allocator<char>::~allocator(local_41);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::cbegin
              (in_stack_fffffffffffffed8);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::cend
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::begin
              (in_stack_fffffffffffffed8);
    __first._M_current._4_4_ = in_stack_fffffffffffffefc;
    __first._M_current._0_4_ = in_stack_fffffffffffffef8;
    __last._M_current._4_4_ = in_stack_fffffffffffffef4;
    __last._M_current._0_4_ = in_stack_fffffffffffffef0;
    __result._M_current._4_4_ = in_stack_fffffffffffffeec;
    __result._M_current._0_4_ = in_stack_fffffffffffffee8;
    std::
    transform<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,int(*)(int)noexcept>
              (__first,__last,__result,
               (_func_int_int *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
    pvVar12 = frozen::
              unordered_map<std::basic_string_view<char,std::char_traits<char>>,helics::CoreType,57ul,frozen::elsa<std::basic_string_view<char,std::char_traits<char>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>
              ::find<std::__cxx11::string>
                        ((unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_helics::CoreType,_57UL,_frozen::elsa<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                          *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
    pvVar15 = pvVar12;
    pvVar13 = frozen::
              unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_helics::CoreType,_57UL,_frozen::elsa<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>
              ::end((unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_helics::CoreType,_57UL,_frozen::elsa<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                     *)0x5960f7);
    if (pvVar12 == pvVar13) {
      pvVar14 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::front((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
      if ((*pvVar14 == '=') ||
         (pvVar14 = CLI::std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::front
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0)),
         *pvVar14 == '-')) {
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                   CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                   CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
        std::__cxx11::string::operator_cast_to_basic_string_view
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
        type_00._M_str = in_RDI;
        type_00._M_len = (size_t)pvVar15;
        local_4 = coreTypeFromString(type_00);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
      }
      else {
        iVar2 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::compare
                          ((basic_string_view<char,_std::char_traits<char>_> *)
                           CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                           CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                           CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                           (char *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
        if (iVar2 == 0) {
          local_4 = ZMQ_SS;
        }
        else {
          iVar3 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::compare
                            ((basic_string_view<char,_std::char_traits<char>_> *)
                             CONCAT44(iVar2,in_stack_ffffffffffffff10),
                             CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                             CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                             (char *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
          if (iVar3 == 0) {
            local_4 = ZMQ_SS;
          }
          else {
            iVar4 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::compare
                              ((basic_string_view<char,_std::char_traits<char>_> *)
                               CONCAT44(iVar2,iVar3),
                               CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                               CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                               (char *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8)
                              );
            if (iVar4 == 0) {
              local_4 = ZMQ_SS;
            }
            else {
              iVar5 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::compare
                                ((basic_string_view<char,_std::char_traits<char>_> *)
                                 CONCAT44(iVar2,iVar3),CONCAT44(iVar4,in_stack_ffffffffffffff08),
                                 CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                                 (char *)CONCAT44(in_stack_fffffffffffffefc,
                                                  in_stack_fffffffffffffef8));
              if (iVar5 == 0) {
                local_4 = ZMQ;
              }
              else {
                iVar6 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::compare
                                  ((basic_string_view<char,_std::char_traits<char>_> *)
                                   CONCAT44(iVar2,iVar3),CONCAT44(iVar4,iVar5),
                                   CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                                   (char *)CONCAT44(in_stack_fffffffffffffefc,
                                                    in_stack_fffffffffffffef8));
                if (iVar6 == 0) {
                  local_4 = INTERPROCESS;
                }
                else {
                  iVar7 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::compare
                                    ((basic_string_view<char,_std::char_traits<char>_> *)
                                     CONCAT44(iVar2,iVar3),CONCAT44(iVar4,iVar5),
                                     CONCAT44(iVar6,in_stack_ffffffffffffff00),
                                     (char *)CONCAT44(in_stack_fffffffffffffefc,
                                                      in_stack_fffffffffffffef8));
                  if (iVar7 == 0) {
                    local_4 = TEST;
                  }
                  else {
                    iVar8 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::compare
                                      ((basic_string_view<char,_std::char_traits<char>_> *)
                                       CONCAT44(iVar2,iVar3),CONCAT44(iVar4,iVar5),
                                       CONCAT44(iVar6,iVar7),
                                       (char *)CONCAT44(in_stack_fffffffffffffefc,
                                                        in_stack_fffffffffffffef8));
                    if (iVar8 == 0) {
                      local_4 = TCP_SS;
                    }
                    else {
                      iVar9 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::compare
                                        ((basic_string_view<char,_std::char_traits<char>_> *)
                                         CONCAT44(iVar2,iVar3),CONCAT44(iVar4,iVar5),
                                         CONCAT44(iVar6,iVar7),
                                         (char *)CONCAT44(iVar8,in_stack_fffffffffffffef8));
                      if (iVar9 == 0) {
                        local_4 = TCP;
                      }
                      else {
                        iVar10 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::compare
                                           ((basic_string_view<char,_std::char_traits<char>_> *)
                                            CONCAT44(iVar2,iVar3),CONCAT44(iVar4,iVar5),
                                            CONCAT44(iVar6,iVar7),(char *)CONCAT44(iVar8,iVar9));
                        if (iVar10 == 0) {
                          local_4 = UDP;
                        }
                        else {
                          iVar10 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::
                                   compare((basic_string_view<char,_std::char_traits<char>_> *)
                                           CONCAT44(iVar2,iVar3),CONCAT44(iVar4,iVar5),
                                           CONCAT44(iVar6,iVar7),(char *)CONCAT44(iVar8,iVar9));
                          if (iVar10 == 0) {
                            local_4 = HTTP;
                          }
                          else {
                            iVar10 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::
                                     compare((basic_string_view<char,_std::char_traits<char>_> *)
                                             CONCAT44(iVar2,iVar3),CONCAT44(iVar4,iVar5),
                                             CONCAT44(iVar6,iVar7),(char *)CONCAT44(iVar8,iVar9));
                            if (iVar10 == 0) {
                              local_4 = MPI;
                            }
                            else {
                              iVar10 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::
                                       compare((basic_string_view<char,_std::char_traits<char>_> *)
                                               CONCAT44(iVar2,iVar3),CONCAT44(iVar4,iVar5),
                                               CONCAT44(iVar6,iVar7),(char *)CONCAT44(iVar8,iVar9));
                              if (iVar10 == 0) {
                                local_4 = INPROC;
                              }
                              else {
                                in_stack_fffffffffffffee4 =
                                     CLI::std::basic_string_view<char,_std::char_traits<char>_>::
                                     compare((basic_string_view<char,_std::char_traits<char>_> *)
                                             CONCAT44(iVar2,iVar3),CONCAT44(iVar4,iVar5),
                                             CONCAT44(iVar6,iVar7),(char *)CONCAT44(iVar8,iVar9));
                                if (in_stack_fffffffffffffee4 == 0) {
                                  local_4 = WEBSOCKET;
                                }
                                else {
                                  in_stack_fffffffffffffee0 =
                                       CLI::std::basic_string_view<char,_std::char_traits<char>_>::
                                       compare((basic_string_view<char,_std::char_traits<char>_> *)
                                               CONCAT44(iVar2,iVar3),CONCAT44(iVar4,iVar5),
                                               CONCAT44(iVar6,iVar7),(char *)CONCAT44(iVar8,iVar9));
                                  if (in_stack_fffffffffffffee0 == 0) {
                                    local_4 = NULLCORE;
                                  }
                                  else {
                                    local_4 = UNRECOGNIZED;
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    else {
      local_4 = pvVar15->second;
    }
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
    return local_4;
  }
  return pvVar15->second;
}

Assistant:

CoreType coreTypeFromString(std::string_view type) noexcept
{
    if (type.empty()) {
        return CoreType::DEFAULT;
    }
    // in case it came from the to_string(CoreType)
    if (type.back() == '_') {
        type.remove_suffix(1);
    }
    const auto* fnd = coreTypes.find(type);
    if (fnd != coreTypes.end()) {
        return fnd->second;
    }
    std::string type2{type};
    std::transform(type2.cbegin(), type2.cend(), type2.begin(), ::tolower);
    fnd = coreTypes.find(type2);
    if (fnd != coreTypes.end()) {
        return fnd->second;
    }
    if ((type2.front() == '=') || (type2.front() == '-')) {
        return coreTypeFromString(type2.substr(1));
    }
    if (type.compare(0, 5, "zmqss") == 0) {
        return CoreType::ZMQ_SS;
    }
    if (type.compare(0, 6, "zmq_ss") == 0) {
        return CoreType::ZMQ_SS;
    }
    if (type.compare(0, 4, "zmq2") == 0) {
        return CoreType::ZMQ_SS;
    }
    if (type.compare(0, 3, "zmq") == 0) {
        return CoreType::ZMQ;
    }
    if (type.compare(0, 3, "ipc") == 0) {
        return CoreType::INTERPROCESS;
    }
    if (type.compare(0, 4, "test") == 0) {
        return CoreType::TEST;
    }
    if (type.compare(0, 5, "tcpss") == 0) {
        return CoreType::TCP_SS;
    }
    if (type.compare(0, 3, "tcp") == 0) {
        return CoreType::TCP;
    }
    if (type.compare(0, 3, "udp") == 0) {
        return CoreType::UDP;
    }
    if (type.compare(0, 4, "http") == 0) {
        return CoreType::HTTP;
    }
    if (type.compare(0, 3, "mpi") == 0) {
        return CoreType::MPI;
    }
    if (type.compare(0, 6, "inproc") == 0) {
        return CoreType::INPROC;
    }
    if (type.compare(0, 3, "web") == 0) {
        return CoreType::WEBSOCKET;
    }
    if (type.compare(0, 4, "null") == 0) {
        return CoreType::NULLCORE;
    }

    return CoreType::UNRECOGNIZED;
}